

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

string * __thiscall
soul::SourceCodeModel::Expression::toString_abi_cxx11_
          (string *__return_storage_ptr__,Expression *this)

{
  bool bVar1;
  reference pSVar2;
  Section *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  *__range1;
  Expression *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::
           vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ::begin(&this->sections);
  s = (Section *)
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::end(&this->sections);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_soul::SourceCodeModel::Expression::Section_*,_std::vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>_>
                                     *)&s), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_soul::SourceCodeModel::Expression::Section_*,_std::vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&pSVar2->text);
    __gnu_cxx::
    __normal_iterator<const_soul::SourceCodeModel::Expression::Section_*,_std::vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeModel::Expression::toString() const
{
    std::string result;

    for (auto& s : sections)
        result += s.text;

    return result;
}